

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderPrimitiveIDFromFragmentShader::iterate
          (GeometryShaderPrimitiveIDFromFragmentShader *this)

{
  ostringstream *this_00;
  GLuint GVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  bool bVar6;
  uint n_channel;
  int iVar7;
  GLuint GVar8;
  deUint32 dVar9;
  uint uVar10;
  undefined4 extraout_var;
  void *pvVar11;
  long lVar12;
  TestError *this_01;
  uint uVar13;
  pointer_____offset_0x10___ *ppuVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float local_1fc;
  float rendered_rgba [4];
  undefined1 local_1b0 [384];
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
               ,0x4d7);
    ppuVar14 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    iVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var,iVar7);
    GVar8 = (**(code **)(lVar12 + 0x3c8))();
    this->m_program_id = GVar8;
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"glCreateProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x4de);
    GVar8 = (**(code **)(lVar12 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar8;
    GVar8 = (**(code **)(lVar12 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_geometry_shader_id = GVar8;
    GVar8 = (**(code **)(lVar12 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar8;
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"glCreateShader() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                    ,0x4e4);
    bVar6 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_program_id,this->m_fragment_shader_id,1,
                       &m_fragment_shader_code,this->m_geometry_shader_id,1,&m_geometry_shader_code,
                       this->m_vertex_shader_id,1,&m_vertex_shader_code,(bool *)0x0);
    if (bVar6) {
      (**(code **)(lVar12 + 0x6f8))(1,&this->m_texture_id);
      (**(code **)(lVar12 + 0xb8))(0xde1,this->m_texture_id);
      (**(code **)(lVar12 + 0x1380))
                (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height)
      ;
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"Error creating a texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x4f2);
      (**(code **)(lVar12 + 0x6d0))(1,&this->m_fbo_id);
      (**(code **)(lVar12 + 0x78))(0x8ca9,this->m_fbo_id);
      (**(code **)(lVar12 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_texture_id,0);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"Error configuring framebuffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x4f9);
      (**(code **)(lVar12 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar12 + 0xd8))(this->m_vao_id);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"Error configuring a vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x4ff);
      GVar8 = this->m_n_drawn_vertices;
      GVar1 = this->m_texture_n_components;
      (**(code **)(lVar12 + 0x6c8))(1,&this->m_vbo_id);
      (**(code **)(lVar12 + 0x40))(0x8892,this->m_vbo_id);
      (**(code **)(lVar12 + 0x150))(0x8892,GVar8 * GVar1 * 4,0,0x88e4);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,
                      "Could not set up a buffer object to hold vertex_position attribute data!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x509);
      (**(code **)(lVar12 + 0x1a00))(0,0,this->m_texture_width,this->m_texture_height);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"glViewport() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x50d);
      (**(code **)(lVar12 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
      (**(code **)(lVar12 + 0x188))(0x4000);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"Could not clear the color buffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x513);
      (**(code **)(lVar12 + 0x1680))(this->m_program_id);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"glUseProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x517);
      (**(code **)(lVar12 + 0x538))(0,0,this->m_n_drawn_vertices);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      glu::checkError(dVar9,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                      ,0x51a);
      pvVar11 = operator_new__((ulong)(this->m_texture_height * this->m_texture_width *
                                      this->m_texture_n_components));
      (**(code **)(lVar12 + 0x78))(0x8ca8);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      if (dVar9 != 0) {
        operator_delete__(pvVar11);
        glu::checkError(dVar9,"glBindFramebuffer() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                        ,0x525);
        pvVar11 = (void *)0x0;
      }
      uVar15 = 0;
      (**(code **)(lVar12 + 0x1220))
                (0,0,this->m_texture_width,this->m_texture_height,0x1908,0x1401,pvVar11);
      dVar9 = (**(code **)(lVar12 + 0x800))();
      if (dVar9 != 0) {
        if (pvVar11 != (void *)0x0) {
          operator_delete__(pvVar11);
        }
        glu::checkError(dVar9,"Reading pixels failed!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
                        ,0x52f);
        pvVar11 = (void *)0x0;
      }
      uVar2 = this->m_squareEdgeSize;
      uVar3 = this->m_texture_height;
      uVar4 = this->m_texture_width;
      GVar8 = this->m_texture_n_components;
      uVar10 = 0;
      do {
        if (uVar3 <= uVar10) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_PASS,"Pass");
          if (pvVar11 != (void *)0x0) {
            operator_delete__(pvVar11);
          }
          return STOP;
        }
        uVar13 = 0;
        for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
          rendered_rgba[0] = 0.0;
          rendered_rgba[1] = 0.0;
          rendered_rgba[2] = 0.0;
          rendered_rgba[3] = 0.0;
          for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
            rendered_rgba[lVar12] =
                 (float)*(byte *)((long)pvVar11 + lVar12 + (ulong)uVar13 + (ulong)uVar15) / 255.0;
          }
          uVar17 = (uVar4 / uVar2) * (uVar10 / uVar2) + (int)((uVar16 & 0xffffffff) / (ulong)uVar2);
          fVar18 = floorf((float)uVar17 * 0.015625);
          fVar19 = (float)uVar17 * 0.00024414062;
          local_1fc = 1.0;
          if ((uVar17 & 1) != 0) {
            local_1fc = 0.0;
          }
          fVar21 = (float)(uVar17 & 0x3f) * 0.015625;
          fVar5 = rendered_rgba[0];
          fVar20 = rendered_rgba[0] - fVar21;
          fVar22 = -fVar20;
          if (-fVar20 <= fVar20) {
            fVar22 = fVar20;
          }
          if (0.00390625 < fVar22) {
LAB_00cf6c6f:
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            this_00 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::operator<<((ostream *)this_00,"Primitive ID: ");
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::operator<<((ostream *)this_00,"Rendered data");
            std::operator<<((ostream *)this_00,"equal (");
            std::ostream::operator<<(this_00,fVar5);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,rendered_rgba[1]);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,rendered_rgba[2]);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,rendered_rgba[3]);
            std::operator<<((ostream *)this_00,") ");
            std::operator<<((ostream *)this_00,
                            "exceeds allowed epsilon when compared to expected data equal (");
            std::ostream::operator<<(this_00,fVar21);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,fVar18 * 0.015625);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,fVar19);
            std::operator<<((ostream *)this_00,", ");
            std::ostream::operator<<(this_00,local_1fc);
            std::operator<<((ostream *)this_00,").");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            if (pvVar11 != (void *)0x0) {
              operator_delete__(pvVar11);
            }
            tcu::TestContext::setTestResult
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
            return STOP;
          }
          fVar20 = rendered_rgba[1] - fVar18 * 0.015625;
          fVar22 = -fVar20;
          if (-fVar20 <= fVar20) {
            fVar22 = fVar20;
          }
          if (0.00390625 < fVar22) goto LAB_00cf6c6f;
          fVar20 = rendered_rgba[2] - fVar19;
          fVar22 = -fVar20;
          if (-fVar20 <= fVar20) {
            fVar22 = fVar20;
          }
          if (0.00390625 < fVar22) goto LAB_00cf6c6f;
          fVar20 = rendered_rgba[3] - local_1fc;
          fVar22 = -fVar20;
          if (-fVar20 <= fVar20) {
            fVar22 = fVar20;
          }
          if (0.00390625 < fVar22) goto LAB_00cf6c6f;
          uVar13 = uVar13 + GVar8;
        }
        uVar10 = uVar10 + 1;
        uVar15 = uVar15 + uVar4 * GVar8;
      } while( true );
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Program could not have been created sucessfully",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveCounter.cpp"
               ,0x4ea);
    ppuVar14 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_01,ppuVar14,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderPrimitiveIDFromFragmentShader::iterate(void)
{
	const float epsilon = 1.0f / 256.0f;

	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object */
	m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Create shader objects */
	m_vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	m_geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Build the program object */
	if (!buildProgram(m_program_id, m_fragment_shader_id, 1, &m_fragment_shader_code, m_geometry_shader_id, 1,
					  &m_geometry_shader_code, m_vertex_shader_id, 1, &m_vertex_shader_code))
	{
		TCU_FAIL("Program could not have been created sucessfully");
	}

	/* Create and configure a texture object we'll be rendering to */
	gl.genTextures(1, &m_texture_id);
	gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating a texture object!");

	/* Create and configure the framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer object!");

	/* Create and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a vertex array object");

	/* Set up a buffer object we will use to hold vertex_position attribute data */
	const glw::GLuint sizeOfDataArray =
		static_cast<glw::GLuint>(m_n_drawn_vertices * m_texture_n_components * sizeof(glw::GLfloat));

	gl.genBuffers(1, &m_vbo_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_vbo_id);
	gl.bufferData(GL_ARRAY_BUFFER, sizeOfDataArray, DE_NULL, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up a buffer object to hold vertex_position attribute data!");

	/* Set up the viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed");

	/* Clear the color buffer */
	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer!");

	/* Render the test geometry */
	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.drawArrays(GL_POINTS, 0 /* first */, m_n_drawn_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Read the rendered data */
	glw::GLubyte* resultBuffer = new glw::GLubyte[m_texture_width * m_texture_height * m_texture_n_components];

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);
	int error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		delete[] resultBuffer;
		resultBuffer = NULL;
		GLU_EXPECT_NO_ERROR(error, "glBindFramebuffer() call failed");
	}

	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, resultBuffer);

	error = gl.getError();
	if (error != GL_NO_ERROR)
	{
		delete[] resultBuffer;
		resultBuffer = NULL;
		GLU_EXPECT_NO_ERROR(error, "Reading pixels failed!");
	}

	/* Loop over all pixels and compare the rendered data with reference values */
	for (glw::GLuint y = 0; y < m_texture_height; ++y)
	{
		glw::GLubyte* data_row = resultBuffer + y * m_texture_width * m_texture_n_components;

		for (glw::GLuint x = 0; x < m_texture_width; ++x)
		{
			glw::GLuint   column	  = (x / m_squareEdgeSize);
			glw::GLubyte* data		  = data_row + x * m_texture_n_components;
			glw::GLuint   row		  = (y / m_squareEdgeSize);
			glw::GLuint   primitiveID = column + (row * (m_texture_width / m_squareEdgeSize));

			/* Calculate expected and rendered pixel color */
			float rendered_rgba[4] = { 0 };
			float expected_rgba[4];

			for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
			{
				rendered_rgba[n_channel] = float(data[n_channel]) / 255.0f;
			}

			expected_rgba[0] = (glw::GLfloat)(primitiveID % 64) / 64.0f;
			expected_rgba[1] = deFloatFloor((glw::GLfloat)(primitiveID) / 64.0f) / 64.0f;
			expected_rgba[2] = (glw::GLfloat)(primitiveID) / 4096.0f;
			expected_rgba[3] = (((primitiveID % 2) == 0) ? 1.0f : 0.0f);

			/* Compare the data */
			if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
				de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
				de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
				de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Primitive ID: " << primitiveID << "Rendered data"
								   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
								   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
								   << "exceeds allowed epsilon when compared to expected data equal ("
								   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2] << ", "
								   << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

				delete[] resultBuffer;
				resultBuffer = NULL;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (rendered data is invalid) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	delete[] resultBuffer;
	resultBuffer = NULL;

	return STOP;
}